

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

ostream * google::operator<<(ostream *os,PRIVATE_Counter *param_2)

{
  long lVar1;
  ostream *poVar2;
  LogMessageFatal LStack_18;
  
  lVar1 = __dynamic_cast(os,&std::ostream::typeinfo,&LogMessage::LogStream::typeinfo,0);
  if ((lVar1 != 0) && (lVar1 == *(long *)(lVar1 + 0x50))) {
    std::ostream::operator<<(os,*(int *)(lVar1 + 0x48));
    return os;
  }
  LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging.cc"
             ,0x6c9);
  poVar2 = std::operator<<(&((LStack_18.super_LogMessage.data_)->stream_).super_ostream,
                           "Check failed: log && log == log->self() ");
  std::operator<<(poVar2,"You must not use COUNTER with non-glog ostream");
  LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

ostream& operator<<(ostream &os, const PRIVATE_Counter&) {
#ifdef DISABLE_RTTI
  LogMessage::LogStream *log = static_cast<LogMessage::LogStream*>(&os);
#else
  LogMessage::LogStream *log = dynamic_cast<LogMessage::LogStream*>(&os);
#endif
  CHECK(log && log == log->self())
      << "You must not use COUNTER with non-glog ostream";
  os << log->ctr();
  return os;
}